

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSwap
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *other)

{
  uint32 uVar1;
  void *pvVar2;
  string *psVar3;
  UnknownFieldSet *other_00;
  
  pvVar2 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_002c11c7;
LAB_002c11ba:
    other_00 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002c11ba;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002c11c7:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  RepeatedField<int>::InternalSwap(&this->path_,&other->path_);
  RepeatedField<int>::InternalSwap(&this->span_,&other->span_);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,
             &(other->leading_detached_comments_).super_RepeatedPtrFieldBase);
  psVar3 = (this->leading_comments_).ptr_;
  (this->leading_comments_).ptr_ = (other->leading_comments_).ptr_;
  (other->leading_comments_).ptr_ = psVar3;
  psVar3 = (this->trailing_comments_).ptr_;
  (this->trailing_comments_).ptr_ = (other->trailing_comments_).ptr_;
  (other->trailing_comments_).ptr_ = psVar3;
  return;
}

Assistant:

void SourceCodeInfo_Location::InternalSwap(SourceCodeInfo_Location* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  span_.InternalSwap(&other->span_);
  leading_detached_comments_.InternalSwap(&other->leading_detached_comments_);
  leading_comments_.Swap(&other->leading_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  trailing_comments_.Swap(&other->trailing_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
}